

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen_tools.h
# Opt level: O0

int __thiscall
fmt::v10::formatter<Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_char,_void>::
parse_unsigned_int(formatter<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_char,_void>
                   *this,char *begin,char *end)

{
  bool bVar1;
  undefined8 *puVar2;
  int local_24;
  int result;
  char *end_local;
  char *begin_local;
  formatter<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_char,_void> *this_local
  ;
  
  local_24 = 0;
  end_local = begin;
  while( true ) {
    if (end_local == end) {
      return local_24 / 10;
    }
    bVar1 = is_digit(this,*end_local);
    if (!bVar1) break;
    local_24 = (*end_local + -0x30 + local_24) * 10;
    end_local = end_local + 1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "compile time error, this is not a digit.";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

constexpr int parse_unsigned_int(const char* begin, const char* end) {
    int result = 0;
    while (begin != end) {
      if (!is_digit(*begin)) {
        throw "compile time error, this is not a digit.";  // NOLINT(hicpp-exception-baseclass)
      }
      result += (*begin - '0');
      result *= 10;
      ++begin;
    }
    result = result / 10;
    return result;
  }